

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_23c3742::File::read(File *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  size_t i;
  void *pvVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->readMutex);
  pvVar3 = (void *)0x0;
  while ((pvVar2 = __buf, __buf != pvVar3 &&
         (iVar1 = fgetc((FILE *)this->f), pvVar2 = pvVar3, iVar1 != -1))) {
    *(char *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar3) = (char)iVar1;
    pvVar3 = (void *)((long)pvVar3 + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return (ssize_t)pvVar2;
}

Assistant:

size_t read(void* buffer, size_t n) override {
    std::unique_lock<std::mutex> lock(readMutex);
    auto out = reinterpret_cast<char*>(buffer);
    for (size_t i = 0; i < n; i++) {
      int c = fgetc(f);
      if (c == EOF) {
        return i;
      }
      out[i] = char(c);
    }
    return n;
  }